

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3acc_io.c
# Opt level: O2

int rdacc_tmat(char *dir,float32 ****inout_tmat_acc,uint32 *inout_n_tmat,uint32 *inout_n_state_pm)

{
  uint32 d3;
  int iVar1;
  int iVar2;
  uint32 n_state_pm;
  uint32 n_tmat;
  float32 ***in_tmat_acc;
  char fn [4097];
  
  sprintf(fn,"%s/tmat_counts",dir);
  iVar1 = s3tmat_read(fn,&in_tmat_acc,&n_tmat,&n_state_pm);
  iVar2 = -1;
  if (iVar1 != 0) {
    return -1;
  }
  if (*inout_tmat_acc == (float32 ***)0x0) {
    *inout_tmat_acc = in_tmat_acc;
    *inout_n_tmat = n_tmat;
    *inout_n_state_pm = n_state_pm;
LAB_001067e5:
    iVar2 = 0;
  }
  else {
    if (*inout_n_tmat == n_tmat) {
      d3 = *inout_n_state_pm;
      if (d3 == n_state_pm) {
        accum_3d(*inout_tmat_acc,in_tmat_acc,n_tmat,d3 - 1,d3);
        ckd_free_3d(in_tmat_acc);
        goto LAB_001067e5;
      }
    }
    else {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3acc_io.c"
              ,0x60,"# tmat in, %u != prior # tmat, %u\n");
      if (*inout_n_state_pm == n_state_pm) {
        return -1;
      }
    }
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3acc_io.c"
            ,0x65,"# tmat in, %u != prior # tmat, %u\n");
  }
  return iVar2;
}

Assistant:

int
rdacc_tmat(const char *dir,
           float32 **** inout_tmat_acc,
           uint32 * inout_n_tmat, uint32 * inout_n_state_pm)
{
    char fn[MAXPATHLEN + 1];
    float32 ***in_tmat_acc;
    float32 ***tmat_acc;
    uint32 n_tmat;
    uint32 n_state_pm;

    sprintf(fn, "%s/tmat_counts", dir);

    if (s3tmat_read(fn,
                    &in_tmat_acc,
                    &n_tmat, &n_state_pm) != S3_SUCCESS) {
        return S3_ERROR;
    }
    tmat_acc = *inout_tmat_acc;

    if (tmat_acc == NULL) {
        *inout_tmat_acc = tmat_acc = in_tmat_acc;
        *inout_n_tmat = n_tmat;
        *inout_n_state_pm = n_state_pm;
    }
    else {
        int err = FALSE;

        if (*inout_n_tmat != n_tmat) {
            E_ERROR("# tmat in, %u != prior # tmat, %u\n",
                    n_tmat, *inout_n_tmat);
            err = TRUE;
        }
        if (*inout_n_state_pm != n_state_pm) {
            E_ERROR("# tmat in, %u != prior # tmat, %u\n",
                    n_state_pm, *inout_n_state_pm);
            err = TRUE;
        }

        if (err)
            return S3_ERROR;

        accum_3d(tmat_acc, in_tmat_acc,
                 n_tmat, n_state_pm - 1, n_state_pm);

        ckd_free_3d((void ***) in_tmat_acc);
    }

    return S3_SUCCESS;
}